

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

void lambert_lighting(vec3f light_dir,Model *model,TGAImage *image)

{
  double dVar1;
  size_t sVar2;
  vec2i vVar3;
  vec<3UL,_double> *pvVar4;
  size_t j;
  size_t sVar5;
  vec2i screen_coords [3];
  vec3f world_coords [3];
  vec3f local_e8;
  TGAImage *local_d0;
  vec2i local_c8 [4];
  vec<3UL,_double> local_a8;
  vec<3UL,_double> local_90;
  vec<3UL,_double> local_78;
  vec<3UL,_double> vStack_60;
  vec<3UL,_double> local_48;
  
  local_d0 = image;
  sVar2 = Model::nfaces(model);
  if (sVar2 != 0) {
    sVar2 = 0;
    do {
      local_c8[0].x = 0;
      local_c8[0].y = 0;
      local_c8[1].x = 0;
      local_c8[1].y = 0;
      local_c8[2].x = 0;
      local_c8[2].y = 0;
      local_48.z = 0.0;
      local_48.x = 0.0;
      local_48.y = 0.0;
      vStack_60.y = 0.0;
      vStack_60.z = 0.0;
      local_78.z = 0.0;
      vStack_60.x = 0.0;
      local_78.x = 0.0;
      local_78.y = 0.0;
      sVar5 = 0;
      pvVar4 = &local_78;
      do {
        Model::vert(&local_e8,model,sVar2,sVar5);
        vVar3.x = (int)((local_e8.x + 1.0) * 1200.0 * 0.5);
        vVar3.y = (int)((local_e8.y + 1.0) * 1200.0 * 0.5);
        local_c8[sVar5] = vVar3;
        pvVar4->z = local_e8.z;
        pvVar4->x = local_e8.x;
        pvVar4->y = local_e8.y;
        sVar5 = sVar5 + 1;
        pvVar4 = pvVar4 + 1;
      } while (sVar5 != 3);
      operator-(&local_90,&local_48,&local_78);
      operator-(&local_a8,&vStack_60,&local_78);
      local_e8.x = local_90.y * local_a8.z - local_a8.y * local_90.z;
      local_e8.y = local_90.z * local_a8.x - local_a8.z * local_90.x;
      local_e8.z = local_90.x * local_a8.y - local_a8.x * local_90.y;
      vec<3UL,_double>::normalize(&local_e8);
      dVar1 = dot<3ul,double>(&local_e8,&light_dir);
      if (0.0 < dVar1) {
        triangle(local_c8,local_d0,
                 (TGAColor)((uint5)((int)(dVar1 * 255.0) & 0xff) * 0x10101 | 0x4ff000000));
      }
      sVar2 = sVar2 + 1;
      sVar5 = Model::nfaces(model);
    } while (sVar2 < sVar5);
  }
  return;
}

Assistant:

void lambert_lighting(vec3f light_dir, Model &model, TGAImage &image)
{
    for (size_t i = 0; i < model.nfaces(); i++) {
        vec2i screen_coords[3];
        vec3f world_coords[3];
        for (size_t j = 0; j < 3; j++) {
            vec3f v = model.vert(i, j);
            screen_coords[j] = vec2i(int((v.x + 1.) * width / 2.), int((v.y + 1.) * height / 2.));
            world_coords[j] = v;
        }
        vec3f n = cross(world_coords[2] - world_coords[0], world_coords[1] - world_coords[0]);
        n.normalize();
        double intensity = dot(n, light_dir);
        if (intensity > 0) {
            triangle(screen_coords, image,
                     TGAColor(static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255),
                              static_cast<uint8_t>(intensity * 255), 255));
        }
    }
}